

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointFrame.cpp
# Opt level: O3

void __thiscall chrono::fea::ChLinkPointFrame::ConstraintsLoadJacobians(ChLinkPointFrame *this)

{
  ChConstraintTwoGeneric *this_00;
  ChConstraintTwoGeneric *this_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  element_type *peVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  Index index;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ChConstraintTwoGeneric *this_02;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  ChMatrix33<double> Jxb;
  ChMatrix33<double> Jxn;
  ChMatrix33<double> Jrb;
  ChMatrix33<double> Aow;
  ChMatrix33<double> Arw;
  ChMatrix33<double> Aro;
  assign_op<double,_double> local_271;
  SrcEvaluatorType local_270;
  plainobjectbase_evaluator_data<double,_3> local_248;
  ChMatrix33<double> local_240;
  ChMatrix33<double> local_1f8;
  DstXprType local_1b0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_168;
  undefined1 local_148 [16];
  double local_138;
  double local_130;
  double dStack_128;
  double local_120;
  undefined1 local_118 [16];
  double local_108;
  ChMatrix33<double> *local_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  undefined8 local_e0;
  ulong local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  ChMatrix33<double> local_b8;
  undefined1 local_70 [72];
  
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_70,&(this->m_csys).rot);
  ChMatrix33<double>::ChMatrix33
            ((ChMatrix33<double> *)local_148,
             &(((this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->super_ChFrameMoving<double>).super_ChFrame<double>.coord.rot);
  local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_148;
  local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_70;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_b8,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_1f8);
  local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&local_b8;
  ChMatrix33<double>::ChMatrix33<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>>
            (&local_1f8,
             (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)&local_240);
  local_100 = &local_b8;
  ChMatrix33<double>::
  ChMatrix33<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>>
            (&local_240,
             (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>_>
              *)&local_100);
  peVar3 = (this->m_node).super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar4 = (this->m_body).super___shared_ptr<chrono::ChBodyFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_168.m_dst = (DstEvaluatorType *)&local_248;
  local_168.m_src = &local_270;
  dVar5 = *(double *)&peVar3->field_0x28 -
          *(double *)
           ((long)(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data + 8);
  dVar6 = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20 -
          (peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar7 = *(double *)&peVar3->field_0x30 -
          *(double *)
           ((long)(peVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data +
           0x10);
  local_248.data = (double *)&local_1b0;
  local_100 = (ChMatrix33<double> *)0x0;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_168.m_functor = &local_271;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_138;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar6;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar5 * local_120;
  auVar1 = vfmadd231sd_fma(auVar17,auVar12,auVar1);
  auVar14._0_8_ = dVar5 * local_130;
  auVar14._8_8_ = dVar5 * dStack_128;
  auVar13._8_8_ = dVar6;
  auVar13._0_8_ = dVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_108;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar7;
  auVar2 = vfmadd231sd_fma(auVar1,auVar16,auVar2);
  auVar1 = vfmadd132pd_fma(auVar13,auVar14,local_148);
  auVar15._8_8_ = dVar7;
  auVar15._0_8_ = dVar7;
  auVar1 = vfmadd132pd_fma(auVar15,auVar1,local_118);
  local_e8 = auVar2._0_8_;
  local_f8 = local_e8 ^ 0x8000000000000000;
  uStack_f0 = auVar1._8_8_;
  local_d8 = auVar1._0_8_ ^ 0x8000000000000000;
  uStack_d0 = uStack_f0 ^ 0x8000000000000000;
  local_e0 = 0;
  local_c8 = vmovlpd_avx(auVar1);
  local_c0 = 0;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhs.m_matrix = (non_const_type)local_70;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs = (type)&local_100;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
          )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )local_70;
  local_270.
  super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)&local_100;
  local_168.m_dstExpr = (DstXprType *)local_248.data;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_168);
  this_00 = &this->constraint1;
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_270,this_00);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 3) goto LAB_0061c794;
  uVar9 = 3;
  if (((ulong)local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix & 7) == 0) {
    uVar10 = -((uint)((ulong)local_270.
                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c3a4;
  }
  else {
LAB_0061c3a4:
    uVar11 = 0;
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar11] =
           local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           [uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar9] =
           local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           [uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  this_01 = &this->constraint2;
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_270,this_01);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 3) goto LAB_0061c794;
  uVar9 = 3;
  if (((ulong)local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix & 7) == 0) {
    uVar10 = -((uint)((ulong)local_270.
                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c420;
  }
  else {
LAB_0061c420:
    uVar11 = 0;
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar11] =
           *(double *)
            ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar11 * 8 + 0x18);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar9] =
           *(double *)
            ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar9 * 8 + 0x18);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  this_02 = &this->constraint3;
  ChConstraintTwoGeneric::Get_Cq_a((ChRowVectorRef *)&local_270,this_02);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 3) goto LAB_0061c794;
  uVar9 = 3;
  if (((ulong)local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix & 7) == 0) {
    uVar10 = -((uint)((ulong)local_270.
                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c49c;
  }
  else {
LAB_0061c49c:
    uVar11 = 0;
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar11] =
           *(double *)
            ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar11 * 8 + 0x30);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar9] =
           *(double *)
            ((long)local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar9 * 8 + 0x30);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_00);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 3) goto LAB_0061c794;
  uVar9 = 3;
  if (((ulong)local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix & 7) == 0) {
    uVar10 = -((uint)((ulong)local_270.
                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c511;
  }
  else {
LAB_0061c511:
    uVar11 = 0;
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar11] =
           local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           [uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar9] =
           local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
           [uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_01);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 3) goto LAB_0061c794;
  uVar9 = 3;
  if (((ulong)local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix & 7) == 0) {
    uVar10 = -((uint)((ulong)local_270.
                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c580;
  }
  else {
LAB_0061c580:
    uVar11 = 0;
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar11] =
           *(double *)
            ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar11 * 8 + 0x18);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar9] =
           *(double *)
            ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar9 * 8 + 0x18);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_02);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 3) goto LAB_0061c794;
  uVar9 = 3;
  if (((ulong)local_270.
              super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
              .m_lhs.m_matrix & 7) == 0) {
    uVar10 = -((uint)((ulong)local_270.
                             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             .m_lhs.m_matrix >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c5ef;
  }
  else {
LAB_0061c5ef:
    uVar11 = 0;
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar11] =
           *(double *)
            ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar11 * 8 + 0x30);
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      ((plain_array<double,_9,_1,_0> *)
      ((local_270.
        super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).m_storage.
      m_data.array)->array[uVar9] =
           *(double *)
            ((long)local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array + uVar9 * 8 + 0x30);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_00);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 6) goto LAB_0061c794;
  uVar9 = 3;
  pdVar8 = ((plain_array<double,_9,_1,_0> *)
           ((local_270.
             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
           m_storage.m_data.array)->array + 3;
  if (((ulong)pdVar8 & 7) == 0) {
    uVar10 = -((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c662;
  }
  else {
LAB_0061c662:
    uVar11 = 0;
    do {
      pdVar8[uVar11] =
           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      pdVar8[uVar9] =
           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_01);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 6) goto LAB_0061c794;
  uVar9 = 3;
  pdVar8 = ((plain_array<double,_9,_1,_0> *)
           ((local_270.
             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
           m_storage.m_data.array)->array + 3;
  if (((ulong)pdVar8 & 7) == 0) {
    uVar10 = -((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 != 0) goto LAB_0061c6da;
  }
  else {
LAB_0061c6da:
    uVar11 = 0;
    do {
      pdVar8[uVar11] =
           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar11 + 3];
      uVar11 = uVar11 + 1;
    } while (uVar9 != uVar11);
  }
  if (uVar9 < 3) {
    do {
      pdVar8[uVar9] =
           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar9 + 3];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  ChConstraintTwoGeneric::Get_Cq_b((ChRowVectorRef *)&local_270,this_02);
  if ((long)local_270.
            super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhsImpl.
            super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            .m_argImpl.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.data
      < 6) {
LAB_0061c794:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Ref<Eigen::Matrix<double, 1, -1>>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Ref<Eigen::Matrix<double, 1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  uVar9 = 3;
  pdVar8 = ((plain_array<double,_9,_1,_0> *)
           ((local_270.
             super_product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
             .m_lhs.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>).
           m_storage.m_data.array)->array + 3;
  if (((ulong)pdVar8 & 7) == 0) {
    uVar10 = -((uint)((ulong)pdVar8 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar10 < 3) {
      uVar9 = (ulong)uVar10;
    }
    if (uVar10 == 0) goto LAB_0061c766;
  }
  uVar11 = 0;
  do {
    pdVar8[uVar11] =
         local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
         array[uVar11 + 6];
    uVar11 = uVar11 + 1;
  } while (uVar9 != uVar11);
LAB_0061c766:
  if (uVar9 < 3) {
    do {
      pdVar8[uVar9] =
           local_1b0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[uVar9 + 6];
      uVar9 = uVar9 + 1;
    } while (uVar9 != 3);
  }
  return;
}

Assistant:

void ChLinkPointFrame::ConstraintsLoadJacobians() {
    // compute jacobians
    ChMatrix33<> Aro(m_csys.rot);
    ChMatrix33<> Aow(m_body->GetRot());
    ChMatrix33<> Arw = Aow * Aro;

    ChMatrix33<> Jxn = Arw.transpose();

    ChMatrix33<> Jxb = -Arw.transpose();

    ChStarMatrix33<> atilde(Aow.transpose() * (m_node->GetPos() - m_body->GetPos()));
    ChMatrix33<> Jrb = Aro.transpose() * atilde;

    constraint1.Get_Cq_a().segment(0, 3) = Jxn.row(0);
    constraint2.Get_Cq_a().segment(0, 3) = Jxn.row(1);
    constraint3.Get_Cq_a().segment(0, 3) = Jxn.row(2);

    constraint1.Get_Cq_b().segment(0, 3) = Jxb.row(0);
    constraint2.Get_Cq_b().segment(0, 3) = Jxb.row(1);
    constraint3.Get_Cq_b().segment(0, 3) = Jxb.row(2);

    constraint1.Get_Cq_b().segment(3, 3) = Jrb.row(0);
    constraint2.Get_Cq_b().segment(3, 3) = Jrb.row(1);
    constraint3.Get_Cq_b().segment(3, 3) = Jrb.row(2);
}